

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O3

void ssh2_bpp_new_outgoing_crypto
               (BinaryPacketProtocol *bpp,ssh_cipheralg *cipher,void *ckey,void *iv,ssh2_macalg *mac
               ,_Bool etm_mode,void *mac_key,ssh_compression_alg *compression,
               _Bool delayed_compression)

{
  long lVar1;
  LogContext *pLVar2;
  ssh_cipher *psVar3;
  char *pcVar4;
  ssh2_mac *psVar5;
  undefined8 uVar6;
  ssh_compressor *psVar7;
  char *pcVar8;
  bool bVar9;
  ptrlen pVar10;
  
  if (bpp->vt != &ssh2_bpp_vtable) {
    __assert_fail("bpp->vt == &ssh2_bpp_vtable",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp2.c",
                  0x79,
                  "void ssh2_bpp_new_outgoing_crypto(BinaryPacketProtocol *, const ssh_cipheralg *, const void *, const void *, const ssh2_macalg *, _Bool, const void *, const ssh_compression_alg *, _Bool)"
                 );
  }
  ssh2_bpp_free_outgoing_crypto((ssh2_bpp_state *)&bpp[-2].remote_bugs);
  if (cipher == (ssh_cipheralg *)0x0) {
    bpp[-1].ssh = (Ssh *)0x0;
    *(undefined1 *)&bpp[-1].out_pq.pqb.end.formal_size = 0;
  }
  else {
    psVar3 = (*cipher->new)(cipher);
    bpp[-1].ssh = (Ssh *)psVar3;
    (*psVar3->vt->setkey)(psVar3,ckey);
    (**(code **)(*(long *)bpp[-1].ssh + 0x10))(bpp[-1].ssh,iv);
    lVar1 = *(long *)bpp[-1].ssh;
    if ((*(byte *)(lVar1 + 0x54) & 1) == 0) {
      bVar9 = false;
    }
    else {
      bVar9 = (bpp->remote_bugs & 0x200) == 0;
    }
    *(bool *)&bpp[-1].out_pq.pqb.end.formal_size = bVar9;
    pLVar2 = bpp->logctx;
    pcVar4 = dupprintf("Initialised %s outbound encryption",*(undefined8 *)(lVar1 + 0x58));
    logevent_and_free(pLVar2,pcVar4);
  }
  *(_Bool *)&bpp[-1].ic_in_raw.ctx = etm_mode;
  if (mac == (ssh2_macalg *)0x0) {
    bpp[-1].ic_in_raw.fn = (toplevel_callback_fn_t)0x0;
  }
  else {
    psVar5 = (*mac->new)(mac,(ssh_cipher *)bpp[-1].ssh);
    bpp[-1].ic_in_raw.fn = (toplevel_callback_fn_t)psVar5;
    pVar10.len = (size_t)mac->keylen;
    pVar10.ptr = mac_key;
    (*psVar5->vt->setkey)(psVar5,pVar10);
    pLVar2 = bpp->logctx;
    uVar6 = (**(code **)(*(long *)bpp[-1].ic_in_raw.fn + 0x28))();
    pcVar8 = " (in ETM mode)";
    pcVar4 = "";
    if (!etm_mode) {
      pcVar8 = "";
    }
    if ((bpp[-1].ssh != (Ssh *)0x0) &&
       (pcVar4 = " (required by cipher)", *(long *)(*(long *)bpp[-1].ssh + 0x60) == 0)) {
      pcVar4 = "";
    }
    pcVar4 = dupprintf("Initialised %s outbound MAC algorithm%s%s",uVar6,pcVar8,pcVar4);
    logevent_and_free(pLVar2,pcVar4);
  }
  if ((delayed_compression) && (bpp[-1].ic_out_pq.field_0x13 == '\0')) {
    *(ssh_compression_alg **)&bpp[-1].ic_in_raw.queued = compression;
    bpp[-1].ic_out_pq.ctx = (void *)0x0;
    pcVar4 = "Will enable %s compression after user authentication";
  }
  else {
    *(undefined8 *)&bpp[-1].ic_in_raw.queued = 0;
    psVar7 = (*compression->compress_new)();
    bpp[-1].ic_out_pq.ctx = psVar7;
    if (psVar7 == (ssh_compressor *)0x0) {
      return;
    }
    compression = psVar7->vt;
    pcVar4 = "Initialised %s compression";
  }
  pLVar2 = bpp->logctx;
  pcVar4 = dupprintf(pcVar4,compression->text_name);
  logevent_and_free(pLVar2,pcVar4);
  return;
}

Assistant:

void ssh2_bpp_new_outgoing_crypto(
    BinaryPacketProtocol *bpp,
    const ssh_cipheralg *cipher, const void *ckey, const void *iv,
    const ssh2_macalg *mac, bool etm_mode, const void *mac_key,
    const ssh_compression_alg *compression, bool delayed_compression)
{
    struct ssh2_bpp_state *s;
    assert(bpp->vt == &ssh2_bpp_vtable);
    s = container_of(bpp, struct ssh2_bpp_state, bpp);

    ssh2_bpp_free_outgoing_crypto(s);

    if (cipher) {
        s->out.cipher = ssh_cipher_new(cipher);
        ssh_cipher_setkey(s->out.cipher, ckey);
        ssh_cipher_setiv(s->out.cipher, iv);

        s->cbc_ignore_workaround = (
            (ssh_cipher_alg(s->out.cipher)->flags & SSH_CIPHER_IS_CBC) &&
            !(s->bpp.remote_bugs & BUG_CHOKES_ON_SSH2_IGNORE));

        bpp_logevent("Initialised %s outbound encryption",
                     ssh_cipher_alg(s->out.cipher)->text_name);
    } else {
        s->out.cipher = NULL;
        s->cbc_ignore_workaround = false;
    }
    s->out.etm_mode = etm_mode;
    if (mac) {
        s->out.mac = ssh2_mac_new(mac, s->out.cipher);
        ssh2_mac_setkey(s->out.mac, make_ptrlen(mac_key, mac->keylen));

        bpp_logevent("Initialised %s outbound MAC algorithm%s%s",
                     ssh2_mac_text_name(s->out.mac),
                     etm_mode ? " (in ETM mode)" : "",
                     (s->out.cipher &&
                      ssh_cipher_alg(s->out.cipher)->required_mac ?
                      " (required by cipher)" : ""));
    } else {
        s->out.mac = NULL;
    }

    if (delayed_compression && !s->seen_userauth_success) {
        s->out.pending_compression = compression;
        s->out_comp = NULL;

        bpp_logevent("Will enable %s compression after user authentication",
                     s->out.pending_compression->text_name);
    } else {
        s->out.pending_compression = NULL;

        /* 'compression' is always non-NULL, because no compression is
         * indicated by ssh_comp_none. But this setup call may return a
         * null out_comp. */
        s->out_comp = ssh_compressor_new(compression);

        if (s->out_comp)
            bpp_logevent("Initialised %s compression",
                         ssh_compressor_alg(s->out_comp)->text_name);
    }
}